

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.h
# Opt level: O2

void __thiscall
google::protobuf::internal::MicroString::
SetMaybeConstant<google::protobuf::internal::MicroStringExtraImpl<15ul>>
          (MicroString *this,MicroStringExtraImpl<15UL> *self,string_view data,Arena *arena)

{
  string_view data_00;
  
  data_00._M_str = (char *)data._M_len;
  data_00._M_len = (size_t)self;
  SetImpl(this,data_00,(Arena *)data._M_str,0xf);
  return;
}

Assistant:

static void SetMaybeConstant(Self& self, absl::string_view data,
                               Arena* arena) {
    const size_t size = data.size();
    if (PROTOBUF_BUILTIN_CONSTANT_P(size <= Self::kInlineCapacity) &&
        size <= Self::kInlineCapacity && self.is_inline()) {
      // Using a separate local variable allows the optimizer to merge the
      // writes better. We do a single write to memory on the assingment below.
      Self tmp;
      tmp.set_inline_size(size);
      if (size != 0) {
        memcpy(tmp.inline_head(), data.data(), data.size());
      }
      self = tmp;
      return;
    }
    self.SetImpl(data, arena, Self::kInlineCapacity);
  }